

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprCodeVector(Parse *pParse,Expr *p,int *piFreeable)

{
  u8 uVar1;
  int iVar2;
  u8 uVar3;
  uint uVar4;
  Select *pSVar5;
  long lVar6;
  int target;
  
  uVar1 = p->op;
  uVar3 = uVar1;
  if (uVar1 == 0x9d) {
    uVar3 = p->op2;
  }
  if (uVar3 == 'w') {
    pSVar5 = (p->x).pSelect;
  }
  else {
    uVar4 = 1;
    if (uVar3 != 0x9e) goto LAB_0015dc9b;
    pSVar5 = (Select *)&p->x;
  }
  uVar4 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pEList)->pList->nExpr;
LAB_0015dc9b:
  if (uVar4 == 1) {
    iVar2 = sqlite3ExprCodeTemp(pParse,p,piFreeable);
    return iVar2;
  }
  *piFreeable = 0;
  if (uVar1 == 'w') {
    iVar2 = sqlite3CodeSubselect(pParse,p,0,0);
    return iVar2;
  }
  iVar2 = pParse->nMem + 1;
  pParse->nMem = pParse->nMem + uVar4;
  if (0 < (int)uVar4) {
    lVar6 = 0;
    target = iVar2;
    do {
      sqlite3ExprCodeFactorable(pParse,*(Expr **)((long)&((p->x).pList)->a[0].pExpr + lVar6),target)
      ;
      target = target + 1;
      lVar6 = lVar6 + 0x20;
    } while ((ulong)uVar4 << 5 != lVar6);
  }
  return iVar2;
}

Assistant:

static int exprCodeVector(Parse *pParse, Expr *p, int *piFreeable){
  int iResult;
  int nResult = sqlite3ExprVectorSize(p);
  if( nResult==1 ){
    iResult = sqlite3ExprCodeTemp(pParse, p, piFreeable);
  }else{
    *piFreeable = 0;
    if( p->op==TK_SELECT ){
#if SQLITE_OMIT_SUBQUERY
      iResult = 0;
#else
      iResult = sqlite3CodeSubselect(pParse, p, 0, 0);
#endif
    }else{
      int i;
      iResult = pParse->nMem+1;
      pParse->nMem += nResult;
      for(i=0; i<nResult; i++){
        sqlite3ExprCodeFactorable(pParse, p->x.pList->a[i].pExpr, i+iResult);
      }
    }
  }
  return iResult;
}